

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O2

void __thiscall
duckdb::BindContext::RemoveUsingBinding(BindContext *this,string *column_name,UsingColumnSet *set)

{
  iterator iVar1;
  iterator iVar2;
  InternalException *this_00;
  allocator local_51;
  string local_50;
  
  iVar1 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->using_columns)._M_h,column_name);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    local_50._M_dataplus._M_p = (pointer)set;
    iVar2 = ::std::
            _Hashtable<std::reference_wrapper<duckdb::UsingColumnSet>,_std::reference_wrapper<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find((_Hashtable<std::reference_wrapper<duckdb::UsingColumnSet>,_std::reference_wrapper<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)((long)iVar1.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_true>
                             ._M_cur + 0x28),(key_type *)&local_50);
    if (iVar2.super__Node_iterator_base<std::reference_wrapper<duckdb::UsingColumnSet>,_true>._M_cur
        != (__node_type *)0x0) {
      local_50._M_dataplus._M_p = (pointer)set;
      ::std::
      _Hashtable<std::reference_wrapper<duckdb::UsingColumnSet>,_std::reference_wrapper<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::_M_erase((_Hashtable<std::reference_wrapper<duckdb::UsingColumnSet>,_std::reference_wrapper<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)((long)iVar1.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_true>
                           ._M_cur + 0x28));
    }
    if (*(long *)((long)iVar1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_true>
                        ._M_cur + 0x40) == 0) {
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase(&(this->using_columns)._M_h,column_name);
    }
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Attempting to remove using binding that is not there",&local_51);
  InternalException::InternalException(this_00,&local_50);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BindContext::RemoveUsingBinding(const string &column_name, UsingColumnSet &set) {
	auto entry = using_columns.find(column_name);
	if (entry == using_columns.end()) {
		throw InternalException("Attempting to remove using binding that is not there");
	}
	auto &bindings = entry->second;
	if (bindings.find(set) != bindings.end()) {
		bindings.erase(set);
	}
	if (bindings.empty()) {
		using_columns.erase(column_name);
	}
}